

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chi_square_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::chi_square_dist<double>::icdf(chi_square_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  chi_square_dist<double> *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  if ((in_XMM0_Qa <= 0.0) || (1.0 <= in_XMM0_Qa)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  else if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
      local_8 = icdf_(in_RDI,in_stack_ffffffffffffffd8);
    }
    else {
      local_8 = std::numeric_limits<double>::infinity();
    }
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return icdf_(x);
    }